

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O0

Qiniu_Error Qiniu_Mac_Auth(void *self,Qiniu_Header **header,char *url,char *addition,size_t addlen)

{
  char *addr;
  Qiniu_Header *pQVar1;
  Qiniu_Error QVar2;
  char *local_c8;
  char *path;
  Qiniu_Mac mac;
  char local_a8 [4];
  uint digest_len;
  char digest [65];
  char *enc_digest;
  char *auth;
  Qiniu_Error err;
  size_t addlen_local;
  char *addition_local;
  char *url_local;
  Qiniu_Header **header_local;
  void *self_local;
  char *local_10;
  
  mac.secretKey._4_4_ = 0x41;
  QVar2 = Qiniu_Mac_Parse_Url(url,(char **)0x0,(size_t *)0x0,&local_c8,(size_t *)0x0);
  local_10 = QVar2.message;
  self_local = (void *)(ulong)(uint)QVar2.code;
  if (QVar2.code == 200) {
    if (self == (void *)0x0) {
      path = QINIU_ACCESS_KEY;
      mac.accessKey = QINIU_SECRET_KEY;
    }
    else {
      path = *self;
      mac.accessKey = *(char **)((long)self + 8);
    }
    Qiniu_Mac_Hmac((Qiniu_Mac *)&path,local_c8,addition,addlen,local_a8,
                   (uint *)((long)&mac.secretKey + 4));
    register0x00000000 = Qiniu_Memory_Encode(local_a8,(ulong)mac.secretKey._4_4_);
    addr = Qiniu_String_Concat("Authorization: QBox ",path,":",register0x00000000,0);
    Qiniu_Free(stack0xffffffffffffffa0);
    pQVar1 = (Qiniu_Header *)curl_slist_append(*header,addr);
    *header = pQVar1;
    Qiniu_Free(addr);
    self_local = (void *)Qiniu_OK._0_8_;
    local_10 = Qiniu_OK.message;
  }
  QVar2._0_8_ = (ulong)self_local & 0xffffffff;
  QVar2.message = local_10;
  return QVar2;
}

Assistant:

static Qiniu_Error Qiniu_Mac_Auth(
	void *self, Qiniu_Header **header, const char *url, const char *addition, size_t addlen)
{
	Qiniu_Error err;
	char *auth;
	char *enc_digest;
	char digest[EVP_MAX_MD_SIZE + 1];
	unsigned int digest_len = sizeof(digest);
	Qiniu_Mac mac;

	char const *path;
	err = Qiniu_Mac_Parse_Url(url, NULL, NULL, &path, NULL);
	if (err.code != 200)
	{
		return err;
	}

	if (self)
	{
		mac = *(Qiniu_Mac *)self;
	}
	else
	{
		mac.accessKey = QINIU_ACCESS_KEY;
		mac.secretKey = QINIU_SECRET_KEY;
	}
	Qiniu_Mac_Hmac(&mac, path, addition, addlen, digest, &digest_len);
	enc_digest = Qiniu_Memory_Encode(digest, digest_len);

	auth = Qiniu_String_Concat("Authorization: QBox ", mac.accessKey, ":", enc_digest, NULL);
	Qiniu_Free(enc_digest);

	*header = curl_slist_append(*header, auth);
	Qiniu_Free(auth);

	return Qiniu_OK;
}